

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

Image * Image_Function_Helper::Invert(Image *__return_storage_ptr__,InvertForm4 invert,Image *in)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_width,in->_height,in->_colorCount,'\x01');
  (*invert)(in,0,0,__return_storage_ptr__,0,0,__return_storage_ptr__->_width,
            __return_storage_ptr__->_height);
  return __return_storage_ptr__;
}

Assistant:

Image Invert( FunctionTable::InvertForm4 invert,
                  const Image & in )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height(), in.colorCount() );

        invert( in, 0, 0, out, 0, 0, out.width(), out.height() );

        return out;
    }